

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_clnt.c
# Opt level: O0

_Bool rpcb_set(rpcprog_t program,rpcvers_t version,netconfig *nconf,netbuf *address)

{
  mem_format_t p_Var1;
  __uid_t _Var2;
  char *pcVar3;
  CLIENT *clnt;
  clnt_req *cc_00;
  AUTH *auth;
  char *p;
  timespec timeout;
  char *t;
  bool_t rslt;
  clnt_stat stat;
  char uidbuf [32];
  RPCB parms;
  clnt_req *cc;
  CLIENT *client;
  netbuf *address_local;
  netconfig *nconf_local;
  rpcvers_t version_local;
  rpcprog_t program_local;
  
  p_Var1 = __ntirpc_pkg_params.warnx_;
  t._0_4_ = 0;
  if (nconf == (netconfig *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      pcVar3 = clnt_sperrno(RPC_UNKNOWNPROTO);
      (*p_Var1)("%s: %s","rpcb_set",pcVar3);
    }
    version_local._3_1_ = false;
  }
  else if (address == (netbuf *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      pcVar3 = clnt_sperrno(RPC_UNKNOWNADDR);
      (*p_Var1)("%s: %s","rpcb_set",pcVar3);
    }
    version_local._3_1_ = false;
  }
  else {
    clnt = local_rpcb("rpcb_set");
    if ((clnt->cl_error).re_status == RPC_SUCCESS) {
      pcVar3 = taddr2uaddr(nconf,address);
      if (pcVar3 == (char *)0x0) {
        clnt_destroy_it(clnt,"rpcb_set",0x1bf);
        p_Var1 = __ntirpc_pkg_params.warnx_;
        if ((__ntirpc_pkg_params.debug_flags & 4) != 0) {
          pcVar3 = clnt_sperrno(RPC_N2AXLATEFAILURE);
          (*p_Var1)("%s: %s","rpcb_set",pcVar3);
        }
        version_local._3_1_ = false;
      }
      else {
        uidbuf._24_4_ = program;
        uidbuf._28_4_ = version;
        _Var2 = geteuid();
        snprintf((char *)&rslt,0x20,"%d",(ulong)_Var2);
        cc_00 = (clnt_req *)
                (*__ntirpc_pkg_params.malloc_)
                          (0x2e0,
                           "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpcb_clnt.c"
                           ,0x1cf,"rpcb_set");
        auth = authnone_ncreate();
        clnt_req_fill(cc_00,clnt,auth,1,xdr_rpcb,uidbuf + 0x18,xdr_bool,&t);
        timeout.tv_nsec = to.tv_nsec;
        timeout.tv_sec = to.tv_sec;
        t._4_4_ = clnt_req_setup(cc_00,timeout);
        if (t._4_4_ == RPC_SUCCESS) {
          t._4_4_ = clnt_req_wait_reply(cc_00);
        }
        if (t._4_4_ != RPC_SUCCESS) {
          p = rpc_sperror(&cc_00->cc_error,"rpcb_set");
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s",p);
          }
          mem_free(p,0x100);
        }
        clnt_req_release(cc_00);
        clnt_destroy_it(clnt,"rpcb_set",0x1df);
        mem_free(pcVar3,0);
        version_local._3_1_ = (int)t != 0;
      }
    }
    else {
      clnt_destroy_it(clnt,"rpcb_set",0x1b6);
      version_local._3_1_ = false;
    }
  }
  return version_local._3_1_;
}

Assistant:

bool
rpcb_set(rpcprog_t program, rpcvers_t version, const struct netconfig *nconf,
	 /* Network structure of transport */
	 const struct netbuf *address /* Services netconfig address */)
{
	CLIENT *client;
	struct clnt_req *cc;
	RPCB parms;
	char uidbuf[32];
	enum clnt_stat stat;
	bool_t rslt = false;	/* yes, bool_t */

	/* parameter checking */
	if (nconf == NULL) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR, "%s: %s",
			__func__, clnt_sperrno(RPC_UNKNOWNPROTO));
		return (false);
	}
	if (address == NULL) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR, "%s: %s",
			__func__, clnt_sperrno(RPC_UNKNOWNADDR));
		return (false);
	}
	client = local_rpcb(__func__);
	if (CLNT_FAILURE(client)) {
		CLNT_DESTROY(client);
		return (false);
	}

	/* convert to universal */
	/*LINTED const castaway */
	parms.r_addr =
	    taddr2uaddr((struct netconfig *)nconf, (struct netbuf *)address);
	if (!parms.r_addr) {
		CLNT_DESTROY(client);
		__warnx(TIRPC_DEBUG_FLAG_WARN, "%s: %s",
			__func__, clnt_sperrno(RPC_N2AXLATEFAILURE));
		return (false);	/* no universal address */
	}
	parms.r_prog = program;
	parms.r_vers = version;
	parms.r_netid = nconf->nc_netid;
	/*
	 * Though uid is not being used directly, we still send it for
	 * completeness.  For non-unix platforms, perhaps some other
	 * string or an empty string can be sent.
	 */
	(void)snprintf(uidbuf, sizeof(uidbuf), "%d", geteuid());
	parms.r_owner = uidbuf;

	cc = mem_alloc(sizeof(*cc));
	clnt_req_fill(cc, client, authnone_ncreate(), RPCBPROC_SET,
		      (xdrproc_t) xdr_rpcb, &parms,
		      (xdrproc_t) xdr_bool, &rslt);
	stat = clnt_req_setup(cc, to);
	if (stat == RPC_SUCCESS) {
		stat = CLNT_CALL_WAIT(cc);
	}
	if (stat != RPC_SUCCESS) {
		char *t = rpc_sperror(&cc->cc_error, __func__);

		__warnx(TIRPC_DEBUG_FLAG_ERROR, "%s", t);
		mem_free(t, RPC_SPERROR_BUFLEN);
	}

	clnt_req_release(cc);
	CLNT_DESTROY(client);
	mem_free(parms.r_addr, 0);
	return (rslt);
}